

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::ConstantManager::GetNullConstId(ConstantManager *this,Type *type)

{
  uint32_t uVar1;
  Constant *c;
  Instruction *this_00;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  this_00 = GetDefiningInstruction(this,c,0,(inst_iterator *)0x0);
  uVar1 = Instruction::result_id(this_00);
  return uVar1;
}

Assistant:

uint32_t ConstantManager::GetNullConstId(const Type* type) {
  const Constant* c = GetConstant(type, {});
  return GetDefiningInstruction(c)->result_id();
}